

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O1

fixed_precise_measurement * __thiscall
units::fixed_precise_measurement::operator=
          (fixed_precise_measurement *this,precise_measurement *val)

{
  bool bVar1;
  double dVar2;
  precise_unit local_28;
  
  local_28.multiplier_ = (val->units_).multiplier_;
  local_28.base_units_ = (val->units_).base_units_;
  local_28.commodity_ = (val->units_).commodity_;
  bVar1 = precise_unit::operator==(&this->units_,&local_28);
  if (bVar1) {
    dVar2 = val->value_;
  }
  else {
    dVar2 = precise_measurement::value_as(val,&this->units_);
  }
  this->value_ = dVar2;
  return this;
}

Assistant:

fixed_precise_measurement&
        operator=(const precise_measurement& val) noexcept
    {
        value_ = (units_ == val.units()) ? val.value() : val.value_as(units_);
        return *this;
    }